

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  Player *p;
  Player *p_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Printer printer;
  Board board;
  Printer local_43;
  Board local_40;
  
  Board::Board(&local_40,9);
  p = (Player *)operator_new(0x20);
  paVar2 = &(p->name).field_2;
  (p->name)._M_dataplus._M_p = (pointer)paVar2;
  (p->name)._M_string_length = 0;
  (p->name).field_2._M_local_buf[0] = '\0';
  p_00 = (Player *)operator_new(0x20);
  (p_00->name)._M_dataplus._M_p = (pointer)&(p_00->name).field_2;
  (p_00->name)._M_string_length = 0;
  (p_00->name).field_2._M_local_buf[0] = '\0';
  Printer::Printer(&local_43,'.','x','o');
  Board::playAt(&local_40,0,0,p);
  Board::playAt(&local_40,4,5,p_00);
  Board::playAt(&local_40,6,7,p);
  Printer::printBoard(&local_43,&local_40,p);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  Board::removeStone(&local_40,0,0);
  Printer::printBoard(&local_43,&local_40,p);
  pcVar1 = (p->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1);
  }
  operator_delete(p);
  Board::~Board(&local_40);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    // dummy client code for demonstration so far

    int n = 9;
    Board board = Board(n);


    Player *p1 = new Player(),
        *p2 = new Player();
    Printer printer = Printer();


    board.playAt(0,0, p1);
    board.playAt(4,5, p2);
    board.playAt(6,7, p1);


    printer.printBoard(board, p1);
    cout << endl; cout << endl;


    board.removeStone(0,0);
    printer.printBoard(board, p1);

    delete p1, p2;
    return 0;
}